

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testInit
          (VaryingStructureMemberLocationTest *this)

{
  GLuint stage;
  STAGES SVar1;
  testCase test_case_out;
  testCase test_case_in;
  value_type local_30;
  value_type local_28;
  
  SVar1 = COMPUTE;
  do {
    if (SVar1 != COMPUTE) {
      if (SVar1 == STAGE_MAX) {
        return;
      }
      local_28.m_is_input = true;
      local_30.m_is_input = false;
      local_30.m_stage = SVar1;
      local_28.m_stage = SVar1;
      std::
      vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_28);
      if (SVar1 != FRAGMENT) {
        std::
        vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_30);
      }
    }
    SVar1 = SVar1 + VERTEX;
  } while( true );
}

Assistant:

void VaryingStructureMemberLocationTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		if (Utils::Shader::COMPUTE == stage)
		{
			continue;
		}

		testCase test_case_in  = { true, (Utils::Shader::STAGES)stage };
		testCase test_case_out = { false, (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case_in);

		if (Utils::Shader::FRAGMENT != stage)
		{
			m_test_cases.push_back(test_case_out);
		}
	}
}